

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

int IFN_Right_Character(FORM *form)

{
  FIELD *field;
  _Bool _Var1;
  int iVar2;
  int iVar3;
  
  iVar2 = form->curcol;
  form->curcol = iVar2 + 1;
  field = form->current;
  iVar3 = 0;
  if (iVar2 + 1 == field->dcols) {
    if ((int)field->rows + field->nrow == 1) {
      _Var1 = Field_Grown(field,1);
      if (_Var1) {
        return 0;
      }
      iVar2 = form->curcol + -1;
    }
    form->curcol = iVar2;
    iVar3 = -0xc;
  }
  return iVar3;
}

Assistant:

static int IFN_Right_Character(FORM * form)
{
  if ( (++(form->curcol)) == form->current->dcols )
    {
#if GROW_IF_NAVIGATE
      FIELD *field = form->current;
      if (Single_Line_Field(field) && Field_Grown(field,1))
        return(E_OK);
#endif
      --(form->curcol);
      return(E_REQUEST_DENIED);
    }
  return(E_OK);
}